

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageEdgeCircumcenterSign<long_double>
              (Vector3<long_double> *x0,Vector3<long_double> *x1,Vector3<long_double> *a,
              Vector3<long_double> *b,Vector3<long_double> *c,int abc_sign)

{
  int iVar1;
  D *b_00;
  BasicVector<Vector3,_long_double,_3UL> *this;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble lVar3;
  longdouble local_f8;
  longdouble local_e8;
  longdouble local_d8;
  longdouble local_c8;
  longdouble local_b8;
  longdouble local_a8;
  longdouble local_98;
  Vector3<long_double> nx;
  Vector3<long_double> z;
  
  GetCircumcenter<long_double>(&z,a,b,c,&local_f8);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)x0,x1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((BasicVector<Vector3,_long_double,_3UL> *)x0,x1);
  nx.c_[0]._0_10_ = local_a8 * local_c8 - local_98 * local_d8;
  nx.c_[1]._0_10_ = local_98 * local_e8 - local_c8 * local_b8;
  nx.c_[2]._0_10_ = local_d8 * local_b8 - local_e8 * local_a8;
  this = (BasicVector<Vector3,_long_double,_3UL> *)&z;
  lVar3 = in_ST0;
  lVar2 = in_ST0;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)&nx,(BasicVector<Vector3,_long_double,_3UL> *)&z,b_00);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm((FloatType *)&z,this);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm(nx.c_,this);
  lVar3 = lVar3 * (lVar2 * (longdouble)1.6263033e-19 +
                  (lVar2 * (longdouble)4.464101615137754 + (longdouble)6.153480596427404e-15) *
                  (longdouble)5.421011e-20) + local_f8 * lVar2;
  iVar1 = 1;
  if (in_ST0 * (longdouble)abc_sign <= lVar3) {
    iVar1 = -(uint)(in_ST0 * (longdouble)abc_sign < -lVar3);
  }
  return iVar1;
}

Assistant:

int TriageEdgeCircumcenterSign(const Vector3<T>& x0, const Vector3<T>& x1,
                               const Vector3<T>& a, const Vector3<T>& b,
                               const Vector3<T>& c, int abc_sign) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Compute the circumcenter Z of triangle ABC, and then test which side of
  // edge X it lies on.
  T z_error;
  Vector3<T> z = GetCircumcenter(a, b, c, &z_error);
  Vector3<T> nx = (x0 - x1).CrossProd(x0 + x1);
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  T result = abc_sign * nx.DotProd(z);

  T z_len = z.Norm();
  T nx_len = nx.Norm();
  T nx_error = ((1 + 2 * sqrt(3)) * nx_len + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T result_error = ((3 * T_ERR * nx_len + nx_error) * z_len + z_error * nx_len);
  return (result > result_error) ? 1 : (result < -result_error) ? -1 : 0;
}